

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecXor.c
# Opt level: O3

Vec_Int_t * Acec_RankTrees(Gia_Man_t *p,Vec_Int_t *vXors,Vec_Int_t *vXorRoots)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  uint Entry;
  uint uVar4;
  int *piVar5;
  bool bVar6;
  Vec_Int_t *p_00;
  int *__ptr;
  Vec_Int_t *pVVar7;
  int *__s;
  int iVar8;
  ulong uVar9;
  ulong uVar10;
  uint uVar11;
  ulong uVar12;
  long lVar13;
  
  p_00 = (Vec_Int_t *)malloc(0x10);
  p_00->nCap = 100;
  p_00->nSize = 0;
  __ptr = (int *)malloc(400);
  p_00->pArray = __ptr;
  iVar1 = p->nObjs;
  pVVar7 = (Vec_Int_t *)malloc(0x10);
  iVar8 = 0x10;
  if (0xe < iVar1 - 1U) {
    iVar8 = iVar1;
  }
  pVVar7->nCap = iVar8;
  if (iVar8 == 0) {
    pVVar7->pArray = (int *)0x0;
    pVVar7->nSize = iVar1;
LAB_00687c20:
    __s = (int *)0x0;
  }
  else {
    __s = (int *)malloc((long)iVar8 << 2);
    pVVar7->pArray = __s;
    pVVar7->nSize = iVar1;
    if (__s == (int *)0x0) goto LAB_00687c20;
    memset(__s,0xff,(long)iVar1 << 2);
  }
  iVar8 = vXorRoots->nSize;
  if (0 < (long)iVar8) {
    piVar5 = vXorRoots->pArray;
    uVar9 = 0;
    do {
      iVar2 = piVar5[uVar9];
      if (((long)iVar2 < 0) || (iVar1 <= iVar2)) goto LAB_00687e3d;
      __s[iVar2] = (int)uVar9;
      uVar9 = uVar9 + 1;
    } while (uVar9 < (ulong)(long)iVar8);
  }
  uVar3 = vXors->nSize;
  if ((int)uVar3 < 4) {
LAB_00687dd4:
    if (__ptr == (int *)0x0) goto LAB_00687de1;
  }
  else {
    uVar11 = uVar3 & 0xfffffffc;
    uVar9 = (ulong)(uVar3 >> 2);
    do {
      uVar11 = uVar11 - 4;
      lVar13 = uVar9 * 4 + -4;
      if (vXors->nSize <= lVar13) {
LAB_00687dff:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      iVar8 = vXors->pArray[lVar13];
      if (((long)iVar8 < 0) || (iVar1 <= iVar8)) goto LAB_00687dff;
      uVar3 = __s[iVar8];
      if (uVar3 != 0xffffffff) {
        uVar12 = (ulong)uVar11;
        lVar13 = 3;
        do {
          uVar12 = uVar12 + 1;
          if (vXors->nSize <= (int)uVar12) goto LAB_00687dff;
          Entry = vXors->pArray[uVar12];
          uVar10 = (ulong)Entry;
          if (uVar10 != 0) {
            if (((int)Entry < 0) || (iVar1 <= (int)Entry)) goto LAB_00687dff;
            uVar4 = __s[uVar10];
            if (uVar4 != uVar3) {
              if (uVar4 == 0xffffffff) {
                __s[uVar10] = uVar3;
              }
              else {
                Vec_IntPush(p_00,Entry);
                if (p->nObjs <= (int)Entry) {
                  __assert_fail("v >= 0 && v < p->nObjs",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                                ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
                }
                if ((~*(uint *)(p->pObjs + uVar10) & 0x1fffffff) != 0 &&
                    -1 < (int)*(uint *)(p->pObjs + uVar10)) {
                  printf("Xor node %d belongs to Tree %d and Tree %d.\n",(ulong)Entry,(ulong)uVar4,
                         (ulong)uVar3);
                }
              }
            }
          }
          lVar13 = lVar13 + -1;
        } while (lVar13 != 0);
      }
      bVar6 = 1 < (long)uVar9;
      uVar9 = uVar9 - 1;
    } while (bVar6);
    iVar8 = p_00->nSize;
    __ptr = p_00->pArray;
    if ((long)iVar8 < 1) goto LAB_00687dd4;
    lVar13 = 0;
    do {
      iVar2 = __ptr[lVar13];
      if (((long)iVar2 < 0) || (iVar1 <= iVar2)) {
LAB_00687e3d:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
      }
      __s[iVar2] = -1;
      lVar13 = lVar13 + 1;
    } while (iVar8 != lVar13);
  }
  free(__ptr);
LAB_00687de1:
  free(p_00);
  return pVVar7;
}

Assistant:

Vec_Int_t * Acec_RankTrees( Gia_Man_t * p, Vec_Int_t * vXors, Vec_Int_t * vXorRoots )
{
    Vec_Int_t * vDoubles = Vec_IntAlloc( 100 );
    int i, k, Entry;
    // map roots into their ranks
    Vec_Int_t * vRanks = Vec_IntStartFull( Gia_ManObjNum(p) ); 
    Vec_IntForEachEntry( vXorRoots, Entry, i )
        Vec_IntWriteEntry( vRanks, Entry, i );
    // map nodes into their ranks
    for ( i = Vec_IntSize(vXors)/4 - 1; i >= 0; i-- )
    {
        int Root = Vec_IntEntry( vXors, 4*i );
        int Rank = Vec_IntEntry( vRanks, Root );
        // skip XORs that are not part of any tree
        if ( Rank == -1 )
            continue;
        // iterate through XOR inputs
        for ( k = 1; k < 4; k++ )
        {
            int Node = Vec_IntEntry( vXors, 4*i+k );
            if ( Node == 0 ) // HA
                continue;
            Entry = Vec_IntEntry( vRanks, Node );
            if ( Entry == Rank ) // the same tree
                continue;
            if ( Entry == -1 )
                Vec_IntWriteEntry( vRanks, Node, Rank );
            else
                Vec_IntPush( vDoubles, Node );

            if ( Entry != -1 && Gia_ObjIsAnd(Gia_ManObj(p, Node)))
            printf( "Xor node %d belongs to Tree %d and Tree %d.\n", Node, Entry, Rank );
        }
    }
    // remove duplicated entries
    Vec_IntForEachEntry( vDoubles, Entry, i )
        Vec_IntWriteEntry( vRanks, Entry, -1 );
    Vec_IntFree( vDoubles );
    return vRanks;
}